

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall sznet::net::EventLoop::~EventLoop(EventLoop *this)

{
  char *pcVar1;
  _Any_data *p_Var2;
  Channel *this_00;
  pointer ppCVar3;
  Poller *pPVar4;
  bool bVar5;
  LogStream *pLVar6;
  undefined8 uVar7;
  char **ppcVar8;
  char *in_RSI;
  _Any_data *p_Var9;
  uint *in_FS_OFFSET;
  SourceFile file;
  Logger local_ff0;
  
  this->_vptr_EventLoop = (_func_int **)&PTR__EventLoop_00119ba0;
  if (g_logLevel < 2) {
    file._8_8_ = 0xd;
    file.m_data = "EventLoop.cpp";
    Logger::Logger(&local_ff0,file,0x48,DEBUG,"~EventLoop");
    if (10 < (uint)((int)&local_ff0.m_impl.m_stream.m_buffer.m_cur -
                   (int)local_ff0.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_ff0.m_impl.m_stream.m_buffer.m_cur,"EventLoop ",10);
      local_ff0.m_impl.m_stream.m_buffer.m_cur = local_ff0.m_impl.m_stream.m_buffer.m_cur + 10;
    }
    pLVar6 = LogStream::operator<<(&local_ff0.m_impl.m_stream,this);
    pcVar1 = (pLVar6->m_buffer).m_cur;
    ppcVar8 = &(pLVar6->m_buffer).m_cur;
    if (0xb < (uint)((int)ppcVar8 - (int)pcVar1)) {
      builtin_strncpy(pcVar1," of thread ",0xb);
      *ppcVar8 = *ppcVar8 + 0xb;
    }
    pLVar6 = LogStream::operator<<(pLVar6,this->m_threadId);
    pcVar1 = (pLVar6->m_buffer).m_cur;
    ppcVar8 = &(pLVar6->m_buffer).m_cur;
    if (0x15 < (uint)((int)ppcVar8 - (int)pcVar1)) {
      builtin_strncpy(pcVar1," destructs in thread ",0x15);
      *ppcVar8 = *ppcVar8 + 0x15;
    }
    sznet::CurrentThread::t_cachedTid::__tls_init();
    if (*in_FS_OFFSET == 0) {
      CurrentThread::cacheTid();
    }
    sznet::CurrentThread::t_cachedTid::__tls_init();
    in_RSI = (char *)(ulong)*in_FS_OFFSET;
    LogStream::operator<<(pLVar6,*in_FS_OFFSET);
    Logger::~Logger(&local_ff0);
  }
  bVar5 = isInLoopThread(this);
  if (!bVar5) {
    abortNotInLoopThread(this);
  }
  p_Var9 = (_Any_data *)
           (this->m_pendingFunctors).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (_Any_data *)
           (this->m_pendingFunctors).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (p_Var9 == p_Var2) {
      this_00 = (this->m_wakeupChannel)._M_t.
                super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                ._M_t.
                super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
      this_00->m_events = 0;
      Channel::update(this_00);
      Channel::remove((this->m_wakeupChannel)._M_t.
                      super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                      .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl,in_RSI);
      sockets::sz_close_eventfd(&this->m_wakeupFd);
      in_FS_OFFSET[-0x8e] = 0;
      in_FS_OFFSET[-0x8d] = 0;
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                (&this->m_pendingFunctors);
      MutexLock::~MutexLock(&this->m_mutex);
      ppCVar3 = (this->m_activeChannels).
                super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppCVar3 != (pointer)0x0) {
        operator_delete(ppCVar3);
      }
      std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::~unique_ptr
                (&this->m_wakeupChannel);
      std::unique_ptr<sznet::TimerQueue,_std::default_delete<sznet::TimerQueue>_>::~unique_ptr
                (&this->m_timerQueue);
      pPVar4 = (this->m_poller)._M_t.
               super___uniq_ptr_impl<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>.
               _M_t.
               super__Tuple_impl<0UL,_sznet::net::Poller_*,_std::default_delete<sznet::net::Poller>_>
               .super__Head_base<0UL,_sznet::net::Poller_*,_false>._M_head_impl;
      if (pPVar4 != (Poller *)0x0) {
        (*pPVar4->_vptr_Poller[1])();
      }
      (this->m_poller)._M_t.
      super___uniq_ptr_impl<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>._M_t.
      super__Tuple_impl<0UL,_sznet::net::Poller_*,_std::default_delete<sznet::net::Poller>_>.
      super__Head_base<0UL,_sznet::net::Poller_*,_false>._M_head_impl = (Poller *)0x0;
      return;
    }
    if (*(long *)(p_Var9 + 1) == 0) break;
    (**(code **)((long)p_Var9 + 0x18))(p_Var9);
    p_Var9 = p_Var9 + 2;
  }
  uVar7 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar7);
}

Assistant:

EventLoop::~EventLoop()
{
	LOG_DEBUG << "EventLoop " << this << " of thread " << m_threadId
		<< " destructs in thread " << CurrentThread::tid();
	assertInLoopThread();
	for (const Functor& functor : m_pendingFunctors)
	{
		functor();
	}
	// 停止fd所有事件
	m_wakeupChannel->disableAll();
	// poll中也移除
	m_wakeupChannel->remove();
	sockets::sz_close_eventfd(m_wakeupFd);
	t_loopInThisThread = nullptr;
}